

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void encode_b_nonrd(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData *td,TokenExtra **tp,int mi_row,
                   int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
                   PICK_MODE_CONTEXT *ctx,int *rate)

{
  uint16_t *puVar1;
  uint8_t *puVar2;
  CANDIDATE_MV *pCVar3;
  BLOCK_SIZE BVar4;
  bool bVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  MB_MODE_INFO *pMVar10;
  SequenceHeader *pSVar11;
  MB_MODE_INFO *pMVar12;
  MB_MODE_INFO_EXT_FRAME *pMVar13;
  CANDIDATE_MV CVar14;
  CANDIDATE_MV CVar15;
  CANDIDATE_MV CVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ushort uVar20;
  uint uVar21;
  byte bVar22;
  scale_factors *psVar23;
  char cVar24;
  byte bVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  undefined4 uVar30;
  int *piVar29;
  
  uVar28 = (ulong)bsize;
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  iVar8 = (td->mb).rdmult;
  uVar30 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  pMVar10 = *(td->mb).e_mbd.mi;
  pMVar10->partition = partition;
  piVar29 = (int *)CONCAT44(uVar30,(uint)dry_run);
  av1_update_state(cpi,td,ctx,mi_row,mi_col,bsize,dry_run);
  if (dry_run != 0) {
    encode_superblock(cpi,tile_data,td,tp,dry_run,bsize,piVar29);
    goto LAB_001f22a6;
  }
  pSVar11 = (cpi->common).seq_params;
  iVar26 = pSVar11->subsampling_x;
  iVar9 = pSVar11->subsampling_y;
  *(undefined4 *)((td->mb).mbmi_ext_frame)->cb_offset = *(undefined4 *)(td->mb).cb_offset;
  encode_superblock(cpi,tile_data,td,tp,dry_run,bsize,piVar29);
  puVar1 = (td->mb).cb_offset;
  *puVar1 = *puVar1 + (ushort)block_size_high[uVar28] * (ushort)block_size_wide[uVar28];
  if ((td->mb).e_mbd.is_chroma_ref == true) {
    BVar4 = av1_ss_size_lookup[uVar28][iVar26][iVar9];
    puVar1 = (td->mb).cb_offset + 1;
    *puVar1 = *puVar1 + (ushort)block_size_high[BVar4] * (ushort)block_size_wide[BVar4];
  }
  if ('\0' < pMVar10->ref_frame[1]) {
    uVar20 = *(ushort *)&pMVar10->field_0xa7;
    if (((uVar20 >> 9 & 1) == 0) || ((pMVar10->interinter_comp).type == '\0')) {
      uVar20 = uVar20 & 0xfeff;
    }
    else {
      uVar20 = uVar20 | 0x100;
    }
    *(ushort *)&pMVar10->field_0xa7 = uVar20 | 0x200;
  }
  uVar20 = *(ushort *)&pMVar10->field_0xa7;
  if ((uVar20 & 0x40) == 0) {
    if ((((cpi->common).seg.enabled == '\0') ||
        (((cpi->common).seg.feature_mask[uVar20 & 7] & 0x20) == 0)) &&
       (((char)uVar20 < '\0' || ('\0' < pMVar10->ref_frame[0])))) {
      (td->mb).e_mbd.neighbors_ref_counts[0] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[1] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[2] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[3] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[4] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[5] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[6] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[7] = '\0';
      bVar5 = (td->mb).e_mbd.left_available;
      if (((td->mb).e_mbd.up_available == true) &&
         ((pMVar12 = (td->mb).e_mbd.above_mbmi, (pMVar12->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar12->ref_frame[0])))) {
        puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[0];
        *puVar2 = *puVar2 + '\x01';
        if (0 < (long)pMVar12->ref_frame[1]) {
          puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[1];
          *puVar2 = *puVar2 + '\x01';
        }
      }
      if ((bVar5 != false) &&
         ((pMVar12 = (td->mb).e_mbd.left_mbmi, (pMVar12->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar12->ref_frame[0])))) {
        puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[0];
        *puVar2 = *puVar2 + '\x01';
        if (0 < (long)pMVar12->ref_frame[1]) {
          puVar2 = (td->mb).e_mbd.neighbors_ref_counts + pMVar12->ref_frame[1];
          *puVar2 = *puVar2 + '\x01';
        }
      }
      if (((cpi->common).current_frame.reference_mode == '\x02') && ('\0' < pMVar10->ref_frame[1]))
      {
        (td->rd_counts).compound_ref_used_flag = 1;
      }
      bVar25 = pMVar10->ref_frame[0];
      bVar6 = pMVar10->ref_frame[1];
      iVar26 = -1;
      if ((char)bVar25 < '\t') {
        bVar22 = 1;
        if ('\x01' < (char)bVar25) {
          bVar22 = bVar25;
        }
        iVar26 = (cpi->common).remapped_ref_idx[bVar22 - 1];
      }
      psVar23 = (scale_factors *)0x0;
      if (iVar26 != -1) {
        psVar23 = (cpi->common).ref_scale_factors + iVar26;
      }
      (td->mb).e_mbd.block_ref_scale_factors[0] = psVar23;
      goto joined_r0x001f220e;
    }
  }
  else {
    (td->rd_counts).skip_mode_used_flag = 1;
    if (((cpi->common).current_frame.reference_mode == '\x02') && ('\0' < pMVar10->ref_frame[1])) {
      (td->rd_counts).compound_ref_used_flag = 1;
    }
    bVar25 = pMVar10->ref_frame[0];
    bVar6 = pMVar10->ref_frame[1];
    iVar26 = -1;
    if ((char)bVar25 < '\t') {
      bVar22 = 1;
      if ('\x01' < (char)bVar25) {
        bVar22 = bVar25;
      }
      iVar26 = (cpi->common).remapped_ref_idx[bVar22 - 1];
    }
    psVar23 = (scale_factors *)0x0;
    if (iVar26 != -1) {
      psVar23 = (cpi->common).ref_scale_factors + iVar26;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar23;
joined_r0x001f220e:
    iVar26 = -1;
    if ((char)bVar6 < '\t') {
      uVar21 = 1;
      if ('\x01' < (char)bVar6) {
        uVar21 = (uint)bVar6;
      }
      iVar26 = (cpi->common).remapped_ref_idx[uVar21 - 1];
    }
    psVar23 = (scale_factors *)0x0;
    if (iVar26 != -1) {
      psVar23 = (cpi->common).ref_scale_factors + iVar26;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar23;
  }
  if (((cpi->oxcf).algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY) &&
     (pMVar10->mode == 0x10 || pMVar10->mode < 0xd)) {
    piVar29 = &(td->rd_counts).newmv_or_intra_blocks;
    *piVar29 = *piVar29 +
               (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [uVar28] *
               (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar28];
  }
  if (tile_data->allow_update_cdf != '\0') {
    update_stats(&cpi->common,td);
  }
LAB_001f22a6:
  if (((((cpi->oxcf).q_cfg.aq_mode == '\x03') || ((cpi->active_map).enabled != 0)) &&
      (pMVar10->skip_txfm != '\0')) &&
     (((cpi->rc).rtc_external_ratectrl == 0 && ((cpi->common).seg.enabled != '\0')))) {
    av1_cyclic_reset_segment_skip(cpi,&td->mb,mi_row,mi_col,bsize,dry_run);
  }
  pMVar13 = (td->mb).mbmi_ext_frame;
  pMVar10 = *(td->mb).e_mbd.mi;
  bVar25 = pMVar10->ref_frame[0];
  cVar7 = pMVar10->ref_frame[1];
  if ('\0' < cVar7) {
    cVar24 = -1;
    if (cVar7 < '\x05' || '\x04' < (char)bVar25) {
      lVar27 = 0;
      do {
        if ((bVar25 == (&comp_ref0_lut)[lVar27]) && (cVar7 == (&comp_ref1_lut)[lVar27])) {
          cVar24 = (char)lVar27;
          break;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 9);
    }
    if (cVar24 < '\0') {
      bVar25 = (cVar7 * '\x04' + bVar25) - 0xd;
    }
    else {
      bVar25 = cVar24 + 0x14;
    }
  }
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar25];
  CVar14 = *pCVar3;
  CVar15 = pCVar3[1];
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar25] + 2;
  CVar16 = pCVar3[1];
  pMVar13->ref_mv_stack[2] = *pCVar3;
  pMVar13->ref_mv_stack[3] = CVar16;
  pMVar13->ref_mv_stack[0] = CVar14;
  pMVar13->ref_mv_stack[1] = CVar15;
  *&pMVar13->weight = (td->mb).mbmi_ext.weight[bVar25];
  pMVar13->mode_context = (td->mb).mbmi_ext.mode_context[bVar25];
  pMVar13->ref_mv_count = (td->mb).mbmi_ext.ref_mv_count[bVar25];
  uVar17 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2);
  uVar18 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4);
  uVar19 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6);
  *(undefined8 *)pMVar13->global_mvs = *(undefined8 *)(td->mb).mbmi_ext.global_mvs;
  *(undefined8 *)(pMVar13->global_mvs + 2) = uVar17;
  *(undefined8 *)(pMVar13->global_mvs + 4) = uVar18;
  *(undefined8 *)(pMVar13->global_mvs + 6) = uVar19;
  (td->mb).rdmult = iVar8;
  return;
}

Assistant:

static void encode_b_nonrd(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                           ThreadData *td, TokenExtra **tp, int mi_row,
                           int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                           PARTITION_TYPE partition,
                           PICK_MODE_CONTEXT *const ctx, int *rate) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);
  const int subsampling_x = cpi->common.seq_params->subsampling_x;
  const int subsampling_y = cpi->common.seq_params->subsampling_y;
  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);
  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
      mbmi->compound_idx = 1;
    }
    RD_COUNTS *const rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
          has_second_ref(mbmi)) {
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
              has_second_ref(mbmi)) {
            // This flag is also updated for 4x4 blocks
            rdc->compound_ref_used_flag = 1;
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }
    if (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY &&
        (mbmi->mode == NEWMV || mbmi->mode < INTRA_MODE_END)) {
      int32_t blocks = mi_size_high[bsize] * mi_size_wide[bsize];
      rdc->newmv_or_intra_blocks += blocks;
    }
    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);
  }
  if ((cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ ||
       cpi->active_map.enabled) &&
      mbmi->skip_txfm && !cpi->rc.rtc_external_ratectrl && cm->seg.enabled)
    av1_cyclic_reset_segment_skip(cpi, x, mi_row, mi_col, bsize, dry_run);
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
}